

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_avx2.cpp
# Opt level: O0

void intermediate_adder_avx2
               (uint *b,uint *end,IntermediateBuffer *intermediate,int offset,int *fx,int fdx)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  uint uVar7;
  int in_ECX;
  int iVar8;
  int iVar9;
  long in_RDX;
  uint *in_RSI;
  uint *in_RDI;
  uint *in_R8;
  int in_R9D;
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  uint ag_1;
  uint rb_1;
  uint idistx;
  uint distx;
  int x;
  __m128i ag;
  __m128i rb;
  __m256i vrbag;
  __m256i vmulx;
  __m128i vidx;
  __m128i vdx;
  __m256i vag;
  __m256i vrb;
  __m128i offset_1;
  __m128i v_fx;
  __m128i vdx_shuffle;
  __m128i v_blend;
  __m128i v_fdx;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined1 local_460 [16];
  uint *local_3f8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  uint local_160;
  
  *in_R8 = *in_R8 + in_ECX * -0x10000;
  uVar7 = in_R9D << 2;
  auVar1 = vpinsrd_avx(ZEXT416(uVar7),uVar7,1);
  auVar1 = vpinsrd_avx(auVar1,uVar7,2);
  auVar2 = vpinsrd_avx(auVar1,uVar7,3);
  auVar1 = vpinsrd_avx(ZEXT416(0x800080),0x800080,1);
  auVar1 = vpinsrd_avx(auVar1,0x800080,2);
  auVar3 = vpinsrd_avx(auVar1,0x800080,3);
  auVar1 = vpinsrb_avx(ZEXT116(1),0x80,1);
  auVar1 = vpinsrb_avx(auVar1,1,2);
  auVar1 = vpinsrb_avx(auVar1,0x80,3);
  auVar1 = vpinsrb_avx(auVar1,5,4);
  auVar1 = vpinsrb_avx(auVar1,0x80,5);
  auVar1 = vpinsrb_avx(auVar1,5,6);
  auVar1 = vpinsrb_avx(auVar1,0x80,7);
  auVar1 = vpinsrb_avx(auVar1,9,8);
  auVar1 = vpinsrb_avx(auVar1,0x80,9);
  auVar1 = vpinsrb_avx(auVar1,9,10);
  auVar1 = vpinsrb_avx(auVar1,0x80,0xb);
  auVar1 = vpinsrb_avx(auVar1,0xd,0xc);
  auVar1 = vpinsrb_avx(auVar1,0x80,0xd);
  auVar1 = vpinsrb_avx(auVar1,0xd,0xe);
  auVar1 = vpinsrb_avx(auVar1,0x80,0xf);
  iVar9 = *in_R8 + in_R9D;
  iVar8 = iVar9 + in_R9D;
  auVar12 = vpinsrd_avx(ZEXT416(*in_R8),iVar9,1);
  auVar12 = vpinsrd_avx(auVar12,iVar8,2);
  local_460 = vpinsrd_avx(auVar12,iVar8 + in_R9D,3);
  local_3f8 = in_RDI;
  while (local_3f8 < in_RSI + -3) {
    vpsrld_avx(local_460,ZEXT416(0x10));
    auVar12 = vpunpcklqdq_avx(ZEXT816(0xffffffffffffffff),ZEXT816(0xffffffffffffffff));
    auVar4 = vpunpcklqdq_avx(ZEXT816(0xffffffffffffffff),ZEXT816(0xffffffffffffffff));
    auVar11._16_16_ = auVar4;
    auVar11._0_16_ = auVar12;
    auVar13 = vpgatherdq(ZEXT832(0) << 0x20,auVar11);
    auVar12 = vpunpcklqdq_avx(ZEXT816(0xffffffffffffffff),ZEXT816(0xffffffffffffffff));
    auVar4 = vpunpcklqdq_avx(ZEXT816(0xffffffffffffffff),ZEXT816(0xffffffffffffffff));
    auVar6._16_16_ = auVar4;
    auVar6._0_16_ = auVar12;
    auVar11 = vpgatherdq(ZEXT832(0) << 0x20,auVar6);
    auVar4 = vpshufb_avx(local_460,auVar1);
    auVar12 = vpinsrw_avx(ZEXT216(0x100),0x100,1);
    auVar12 = vpinsrw_avx(auVar12,0x100,2);
    auVar12 = vpinsrw_avx(auVar12,0x100,3);
    auVar12 = vpinsrw_avx(auVar12,0x100,4);
    auVar12 = vpinsrw_avx(auVar12,0x100,5);
    auVar12 = vpinsrw_avx(auVar12,0x100,6);
    auVar12 = vpinsrw_avx(auVar12,0x100,7);
    auVar12 = vpsubw_avx(auVar12,auVar4);
    auVar10 = vpunpckldq_avx(auVar12,auVar4);
    auVar12 = vpunpckhdq_avx(auVar12,auVar4);
    auVar10 = ZEXT116(0) * auVar12 + ZEXT116(1) * auVar10;
    auVar12 = ZEXT116(0) * auVar4 + ZEXT116(1) * auVar12;
    uStack_4f0 = auVar12._0_8_;
    uStack_4e8 = auVar12._8_8_;
    auVar5._16_8_ = uStack_4f0;
    auVar5._0_16_ = auVar10;
    auVar5._24_8_ = uStack_4e8;
    auVar5 = vpmullw_avx2(auVar13,auVar5);
    auVar13._16_8_ = uStack_4f0;
    auVar13._0_16_ = auVar10;
    auVar13._24_8_ = uStack_4e8;
    auVar13 = vpmullw_avx2(auVar11,auVar13);
    auVar5 = vphaddd_avx2(auVar5,auVar13);
    auVar5 = vpermq_avx2(auVar5,0xd8);
    auVar12 = vpsrlw_avx(auVar5._0_16_,ZEXT416(8));
    auVar12 = vpblendvb_avx(auVar5._16_16_,auVar12,auVar3);
    local_1d0 = auVar12._0_8_;
    uStack_1c8 = auVar12._8_8_;
    *(undefined8 *)local_3f8 = local_1d0;
    *(undefined8 *)(local_3f8 + 2) = uStack_1c8;
    local_3f8 = local_3f8 + 4;
    local_460 = vpaddd_avx(local_460,auVar2);
  }
  local_160 = local_460._0_4_;
  *in_R8 = local_160;
  while (local_3f8 < in_RSI) {
    iVar8 = (int)*in_R8 >> 0x10;
    iVar9 = (int)(*in_R8 & 0xffff) >> 8;
    *local_3f8 = (*(int *)(in_RDX + (long)iVar8 * 4) * (0x100 - iVar9) +
                  *(int *)(in_RDX + (long)(iVar8 + 1) * 4) * iVar9 & 0xff00ff00U) >> 8 |
                 *(int *)(in_RDX + 0x2008 + (long)iVar8 * 4) * (0x100 - iVar9) +
                 *(int *)(in_RDX + 0x2008 + (long)(iVar8 + 1) * 4) * iVar9 & 0xff00ff00U;
    local_3f8 = local_3f8 + 1;
    *in_R8 = in_R9D + *in_R8;
  }
  *in_R8 = in_ECX * 0x10000 + *in_R8;
  return;
}

Assistant:

void QT_FASTCALL intermediate_adder_avx2(uint *b, uint *end, const IntermediateBuffer &intermediate, int offset, int &fx, int fdx)
{
    fx -= offset * FixedScale;

    const __m128i v_fdx = _mm_set1_epi32(fdx * 4);
    const __m128i v_blend = _mm_set1_epi32(0x00800080);
    const __m128i vdx_shuffle = _mm_set_epi8(char(0x80), 13, char(0x80), 13, char(0x80), 9, char(0x80), 9,
                                             char(0x80),  5, char(0x80),  5, char(0x80), 1, char(0x80), 1);
    __m128i v_fx = _mm_setr_epi32(fx, fx + fdx, fx + fdx + fdx, fx + fdx + fdx + fdx);

    while (b < end - 3) {
        const __m128i offset = _mm_srli_epi32(v_fx, 16);
        __m256i vrb = _mm256_i32gather_epi64((const long long *)intermediate.buffer_rb, offset, 4);
        __m256i vag = _mm256_i32gather_epi64((const long long *)intermediate.buffer_ag, offset, 4);

        __m128i vdx = _mm_shuffle_epi8(v_fx, vdx_shuffle);
        __m128i vidx = _mm_sub_epi16(_mm_set1_epi16(256), vdx);
        __m256i vmulx = _mm256_castsi128_si256(_mm_unpacklo_epi32(vidx, vdx));
        vmulx = _mm256_inserti128_si256(vmulx, _mm_unpackhi_epi32(vidx, vdx), 1);

        vrb = _mm256_mullo_epi16(vrb, vmulx);
        vag = _mm256_mullo_epi16(vag, vmulx);

        __m256i vrbag = _mm256_hadd_epi32(vrb, vag);
        vrbag = _mm256_permute4x64_epi64(vrbag, _MM_SHUFFLE(3, 1, 2, 0));

        __m128i rb = _mm256_castsi256_si128(vrbag);
        __m128i ag = _mm256_extracti128_si256(vrbag, 1);
        rb = _mm_srli_epi16(rb, 8);

        _mm_storeu_si128((__m128i*)b, _mm_blendv_epi8(ag, rb, v_blend));

        b += 4;
        v_fx = _mm_add_epi32(v_fx, v_fdx);
    }
    fx = _mm_cvtsi128_si32(v_fx);
    while (b < end) {
        const int x = (fx >> 16);

        const uint distx = (fx & 0x0000ffff) >> 8;
        const uint idistx = 256 - distx;
        const uint rb = (intermediate.buffer_rb[x] * idistx + intermediate.buffer_rb[x + 1] * distx) & 0xff00ff00;
        const uint ag = (intermediate.buffer_ag[x] * idistx + intermediate.buffer_ag[x + 1] * distx) & 0xff00ff00;
        *b = (rb >> 8) | ag;
        b++;
        fx += fdx;
    }
    fx += offset * FixedScale;
}